

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es32cRobustBufferAccessBehaviorTests.cpp
# Opt level: O2

string * __thiscall
es32cts::RobustBufferAccessBehavior::TexelFetchTest::getFragmentShader_abi_cxx11_
          (string *__return_storage_ptr__,TexelFetchTest *this,bool is_case_valid)

{
  char *text;
  GLchar *text_00;
  char *text_01;
  char *text_02;
  size_t position;
  allocator<char> local_39;
  size_t local_38;
  
  text_00 = "vec4";
  text = "sampler2D";
  text_01 = "    ivec2 point  = ivec2(gs_fs_tex_coord * 16.0);\n";
  text_02 = "    int   plane  = 0;\n";
  switch((this->super_TexelFetchTest).m_test_case) {
  case R8:
  case RG8_SNORM:
  case RGBA32F:
    text_01 = "    ivec2 point  = ivec2(gs_fs_tex_coord * 16.0) + ivec2(16, 16);\n";
    if (is_case_valid) {
      text_01 = "    ivec2 point  = ivec2(gs_fs_tex_coord * 16.0);\n";
    }
    break;
  case R32UI_MULTISAMPLE:
    text_02 = "    int   plane  = 9;\n";
    if (is_case_valid) {
      text_02 = "    int   plane  = gl_SampleID;\n";
    }
    text_00 = "uvec4";
    text = "usampler2DMS";
    break;
  case R32UI_MIPMAP:
    text_02 = "    int   plane  = 2;\n";
    if (is_case_valid) {
      text_02 = "    int   plane  = 1;\n";
    }
    text_00 = "uvec4";
    text = "usampler2D";
  }
  local_38 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "#version 320 es\n\n                      in  lowp vec2      gs_fs_tex_coord;\nlayout (location = 0) out lowp TYPE      out_fs_color;\n\nlayout (binding = 0) uniform lowp SAMPLER uni_texture;\n\nvoid main()\n{\nPLANE\nPOINT\n    out_fs_color = texelFetch(uni_texture, point, plane);\n}\n\n"
             ,&local_39);
  deqp::RobustBufferAccessBehavior::replaceToken("TYPE",&local_38,text_00,__return_storage_ptr__);
  deqp::RobustBufferAccessBehavior::replaceToken("SAMPLER",&local_38,text,__return_storage_ptr__);
  deqp::RobustBufferAccessBehavior::replaceToken("PLANE",&local_38,text_02,__return_storage_ptr__);
  deqp::RobustBufferAccessBehavior::replaceToken("POINT",&local_38,text_01,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string TexelFetchTest::getFragmentShader(bool is_case_valid)
{
	static const GLchar* plane_0 = "    int   plane  = 0;\n";

	static const GLchar* plane_1 = "    int   plane  = 1;\n";

	static const GLchar* plane_2 = "    int   plane  = 2;\n";

	static const GLchar* plane_sample_invalid = "    int   plane  = 9;\n";

	static const GLchar* plane_sample_valid = "    int   plane  = gl_SampleID;\n";

	static const GLchar* point_invalid = "    ivec2 point  = ivec2(gs_fs_tex_coord * 16.0) + ivec2(16, 16);\n";

	static const GLchar* point_valid = "    ivec2 point  = ivec2(gs_fs_tex_coord * 16.0);\n";

	static const GLchar* sampler_regular		= "sampler2D";
	static const GLchar* sampler_regular_u		= "usampler2D";
	static const GLchar* sampler_multisampled_u = "usampler2DMS";

	static const GLchar* template_code = "#version 320 es\n"
										 "\n"
										 "                      in  lowp vec2      gs_fs_tex_coord;\n"
										 "layout (location = 0) out lowp TYPE      out_fs_color;\n"
										 "\n"
										 "layout (binding = 0) uniform lowp SAMPLER uni_texture;\n"
										 "\n"
										 "void main()\n"
										 "{\n"
										 "PLANE\n"
										 "POINT\n"
										 "    out_fs_color = texelFetch(uni_texture, point, plane);\n"
										 "}\n"
										 "\n";

	static const GLchar* type_vec4  = "vec4";
	static const GLchar* type_uvec4 = "uvec4";

	const GLchar* plane   = plane_0;
	const GLchar* point   = point_valid;
	const GLchar* sampler = sampler_regular;
	const GLchar* type	= type_vec4;

	if ((R8 == m_test_case) || (RG8_SNORM == m_test_case) || (RGBA32F == m_test_case))
	{
		if (false == is_case_valid)
		{
			point = point_invalid;
		}
	}
	else if (R32UI_MIPMAP == m_test_case)
	{
		plane   = plane_1;
		sampler = sampler_regular_u;
		type	= type_uvec4;

		if (false == is_case_valid)
		{
			plane = plane_2;
		}
	}
	else if (R32UI_MULTISAMPLE == m_test_case)
	{
		plane   = plane_sample_valid;
		sampler = sampler_multisampled_u;
		type	= type_uvec4;

		if (false == is_case_valid)
		{
			plane = plane_sample_invalid;
		}
	}

	size_t		position = 0;
	std::string source   = template_code;
	replaceToken("TYPE", position, type, source);
	replaceToken("SAMPLER", position, sampler, source);
	replaceToken("PLANE", position, plane, source);
	replaceToken("POINT", position, point, source);

	return source;
}